

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileBindData::Serialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  bool bVar1;
  const_iterator this;
  QuantileValue *q;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::QuantileValue,_true> *__range1;
  vector<duckdb::Value,_true> raw;
  QuantileBindData *bind_data;
  vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_> *in_stack_ffffffffffffff98;
  FunctionData *in_stack_ffffffffffffffa0;
  reference in_stack_ffffffffffffffa8;
  field_id_t field_id;
  __normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
  local_48;
  vector<duckdb::QuantileValue,_true> *local_40;
  QuantileBindData *local_20;
  
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffffa0);
  local_20 = FunctionData::Cast<duckdb::QuantileBindData>(in_stack_ffffffffffffffa0);
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x9b0924);
  local_40 = &local_20->quantiles;
  local_48._M_current =
       (QuantileValue *)
       std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::begin
                 (in_stack_ffffffffffffff98);
  this = std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::end
                   (in_stack_ffffffffffffff98);
  while( true ) {
    field_id = (field_id_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    in_stack_ffffffffffffffa8 =
         __gnu_cxx::
         __normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
         ::operator*(&local_48);
    std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<duckdb::Value_const&>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)this._M_current,
               &in_stack_ffffffffffffffa8->val);
    __gnu_cxx::
    __normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
    ::operator++(&local_48);
  }
  Serializer::WriteProperty<duckdb::vector<duckdb::Value,true>>
            ((Serializer *)this._M_current,field_id,(char *)in_stack_ffffffffffffffa0,
             (vector<duckdb::Value,_true> *)in_stack_ffffffffffffff98);
  Serializer::WriteProperty<duckdb::vector<unsigned_long,true>>
            ((Serializer *)this._M_current,field_id,(char *)in_stack_ffffffffffffffa0,
             (vector<unsigned_long,_true> *)in_stack_ffffffffffffff98);
  Serializer::WriteProperty<bool>
            ((Serializer *)this._M_current,field_id,(char *)in_stack_ffffffffffffffa0,
             (bool *)in_stack_ffffffffffffff98);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x9b0a16);
  return;
}

Assistant:

void QuantileBindData::Serialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                                 const AggregateFunction &function) {
	auto &bind_data = bind_data_p->Cast<QuantileBindData>();
	vector<Value> raw;
	for (const auto &q : bind_data.quantiles) {
		raw.emplace_back(q.val);
	}
	serializer.WriteProperty(100, "quantiles", raw);
	serializer.WriteProperty(101, "order", bind_data.order);
	serializer.WriteProperty(102, "desc", bind_data.desc);
}